

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compression_utils.cpp
# Opt level: O3

void convertIntArray2ByteArray_fast_1b_to_result_sz
               (uchar *intArray,size_t intArrayLength,uchar **compressed_pos)

{
  byte *pbVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  
  lVar2 = (ulong)((intArrayLength & 7) != 0) + (intArrayLength >> 3);
  if (lVar2 != 0) {
    uVar5 = 0;
    lVar6 = 0;
    do {
      bVar7 = 0;
      if (uVar5 < intArrayLength) {
        uVar3 = 0;
        do {
          bVar4 = 0x80 >> ((byte)uVar3 & 0x1f);
          if (intArray[uVar5] != '\x01') {
            bVar4 = 0;
          }
          bVar7 = bVar4 | bVar7;
          uVar5 = uVar5 + 1;
        } while ((uVar3 < 7) && (uVar3 = uVar3 + 1, uVar5 < intArrayLength));
      }
      pbVar1 = *compressed_pos;
      *compressed_pos = pbVar1 + 1;
      *pbVar1 = bVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void 
convertIntArray2ByteArray_fast_1b_to_result_sz(const unsigned char* intArray, size_t intArrayLength, unsigned char *& compressed_pos){
	size_t byteLength = 0;
	size_t i, j; 
	if(intArrayLength%8==0)
		byteLength = intArrayLength/8;
	else
		byteLength = intArrayLength/8+1;
		
	size_t n = 0;
	int tmp, type;
	for(i = 0;i<byteLength;i++){
		tmp = 0;
		for(j = 0;j<8&&n<intArrayLength;j++){
			type = intArray[n];
			if(type == 1)
				tmp = (tmp | (1 << (7-j)));
			n++;
		}
    	*(compressed_pos++) = (unsigned char)tmp;
	}
}